

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.c
# Opt level: O2

int Waitany(IceTCommunicator self,int count,IceTCommRequest *array_of_requests)

{
  void *__ptr;
  MPI_Request poVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  int local_2c;
  
  __ptr = malloc((long)count << 3);
  if (__ptr == (void *)0x0) {
    icetRaiseDiagnostic("Could not allocate array for MPI requests.",0xfffffffc,1,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/kmorel[P]IceT/src/communication/mpi.c"
                        ,0x1b7);
    iVar3 = -1;
  }
  else {
    uVar4 = 0;
    uVar2 = 0;
    if (0 < count) {
      uVar2 = (ulong)(uint)count;
    }
    for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      poVar1 = getMPIRequest(array_of_requests[uVar4]);
      *(MPI_Request *)((long)__ptr + uVar4 * 8) = poVar1;
    }
    local_2c = (int)uVar2;
    MPI_Waitany(count,__ptr,&local_2c,0);
    setMPIRequest(array_of_requests[local_2c],*(MPI_Request *)((long)__ptr + (long)local_2c * 8));
    destroy_request(array_of_requests[local_2c]);
    iVar3 = local_2c;
    array_of_requests[local_2c] = (IceTCommRequest)0x0;
    free(__ptr);
  }
  return iVar3;
}

Assistant:

static int  Waitany(IceTCommunicator self,
                    int count, IceTCommRequest *array_of_requests)
{
    MPI_Request *mpi_requests;
    int idx;

    /* To remove warning */
    (void)self;

    mpi_requests = malloc(sizeof(MPI_Request)*count);
    if (mpi_requests == NULL) {
        icetRaiseError("Could not allocate array for MPI requests.",
                       ICET_OUT_OF_MEMORY);
        return -1;
    }

    for (idx = 0; idx < count; idx++) {
        mpi_requests[idx] = getMPIRequest(array_of_requests[idx]);
    }

    MPI_Waitany(count, mpi_requests, &idx, MPI_STATUS_IGNORE);

    setMPIRequest(array_of_requests[idx], mpi_requests[idx]);
    destroy_request(array_of_requests[idx]);
    array_of_requests[idx] = ICET_COMM_REQUEST_NULL;

    free(mpi_requests);

    return idx;
}